

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbors.c
# Opt level: O0

void allocate_nn_arrays(long n)

{
  long lVar1;
  long n_local;
  
  lVar1 = max_arrays_size;
  if (max_arrays_size < n) {
    nn = (nn_array *)realloc(nn,n << 6);
    sheared = (Point *)realloc(sheared,n << 4);
    sorted = (long *)realloc(sorted,n << 3);
    aux = (long *)realloc(aux,n << 3);
    if ((((nn == (nn_array *)0x0) || (sheared == (Point *)0x0)) || (sorted == (long *)0x0)) ||
       (lVar1 = n, aux == (long *)0x0)) {
      err_exit("Cannot allocate memory in allocate_nn_arrays!");
      lVar1 = n;
    }
  }
  max_arrays_size = lVar1;
  return;
}

Assistant:

void  allocate_nn_arrays( long  n )
{
  if( max_arrays_size < n ) 
  {
    nn      = (nn_array*)realloc( (void*)nn, (size_t)n*sizeof(nn_array) );
    sheared = (Point*)realloc( (void*)sheared, (size_t)n*sizeof(Point) );
    sorted  = (long*)realloc( (void*)sorted, (size_t)n*sizeof(long) );
    aux     = (long*)realloc( (void*)aux, (size_t)n*sizeof(long) );
    if( !nn || !sheared || !sorted || !aux )
    {
      err_exit( "Cannot allocate memory in allocate_nn_arrays!" );
    }
    max_arrays_size = n;
  }
}